

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool __thiscall
Fossilize::StateReplayer::Impl::parse_sampler_ycbcr_conversion
          (Impl *this,Value *state,VkSamplerYcbcrConversionCreateInfo **out_info)

{
  VkSamplerYcbcrConversionCreateInfo *pVVar1;
  Type pGVar2;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *pGVar3;
  
  pVVar1 = (VkSamplerYcbcrConversionCreateInfo *)
           ScratchAllocator::allocate_raw(&this->allocator,0x40,0x10);
  if (pVVar1 != (VkSamplerYcbcrConversionCreateInfo *)0x0) {
    pVVar1->yChromaOffset = VK_CHROMA_LOCATION_COSITED_EVEN;
    pVVar1->chromaFilter = VK_FILTER_NEAREST;
    *(undefined8 *)&pVVar1->forceExplicitReconstruction = 0;
    (pVVar1->components).g = VK_COMPONENT_SWIZZLE_IDENTITY;
    (pVVar1->components).b = VK_COMPONENT_SWIZZLE_IDENTITY;
    *(undefined8 *)&(pVVar1->components).a = 0;
    pVVar1->format = VK_FORMAT_UNDEFINED;
    pVVar1->ycbcrModel = VK_SAMPLER_YCBCR_MODEL_CONVERSION_RGB_IDENTITY;
    pVVar1->ycbcrRange = VK_SAMPLER_YCBCR_RANGE_ITU_FULL;
    (pVVar1->components).r = VK_COMPONENT_SWIZZLE_IDENTITY;
    *(undefined8 *)pVVar1 = 0;
    pVVar1->pNext = (void *)0x0;
  }
  *out_info = pVVar1;
  pGVar2 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"format");
  if ((undefined1  [16])((undefined1  [16])pGVar2->data_ & (undefined1  [16])0x40000000000000) !=
      (undefined1  [16])0x0) {
    pVVar1->format = (pGVar2->data_).s.length;
    pGVar2 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)state,"ycbcrModel");
    if ((undefined1  [16])((undefined1  [16])pGVar2->data_ & (undefined1  [16])0x40000000000000) !=
        (undefined1  [16])0x0) {
      pVVar1->ycbcrModel = (pGVar2->data_).s.length;
      pGVar2 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)state,"ycbcrRange");
      if ((undefined1  [16])((undefined1  [16])pGVar2->data_ & (undefined1  [16])0x40000000000000)
          != (undefined1  [16])0x0) {
        pVVar1->ycbcrRange = (pGVar2->data_).s.length;
        pGVar2 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)state,"components");
        pGVar3 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::operator[](pGVar2,0);
        if ((undefined1  [16])((undefined1  [16])pGVar3->data_ & (undefined1  [16])0x40000000000000)
            != (undefined1  [16])0x0) {
          (pVVar1->components).r = (pGVar3->data_).s.length;
          pGVar2 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   ::operator[]<char_const>
                             ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                               *)state,"components");
          pGVar3 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   ::operator[](pGVar2,1);
          if ((undefined1  [16])
              ((undefined1  [16])pGVar3->data_ & (undefined1  [16])0x40000000000000) !=
              (undefined1  [16])0x0) {
            (pVVar1->components).g = (pGVar3->data_).s.length;
            pGVar2 = rapidjson::
                     GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                     ::operator[]<char_const>
                               ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                 *)state,"components");
            pGVar3 = rapidjson::
                     GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     ::operator[](pGVar2,2);
            if ((undefined1  [16])
                ((undefined1  [16])pGVar3->data_ & (undefined1  [16])0x40000000000000) !=
                (undefined1  [16])0x0) {
              (pVVar1->components).b = (pGVar3->data_).s.length;
              pGVar2 = rapidjson::
                       GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       ::operator[]<char_const>
                                 ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                   *)state,"components");
              pGVar3 = rapidjson::
                       GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       ::operator[](pGVar2,3);
              if ((undefined1  [16])
                  ((undefined1  [16])pGVar3->data_ & (undefined1  [16])0x40000000000000) !=
                  (undefined1  [16])0x0) {
                (pVVar1->components).a = (pGVar3->data_).s.length;
                pGVar2 = rapidjson::
                         GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         ::operator[]<char_const>
                                   ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                     *)state,"xChromaOffset");
                if ((undefined1  [16])
                    ((undefined1  [16])pGVar2->data_ & (undefined1  [16])0x40000000000000) !=
                    (undefined1  [16])0x0) {
                  pVVar1->xChromaOffset = (pGVar2->data_).s.length;
                  pGVar2 = rapidjson::
                           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           ::operator[]<char_const>
                                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                       *)state,"yChromaOffset");
                  if ((undefined1  [16])
                      ((undefined1  [16])pGVar2->data_ & (undefined1  [16])0x40000000000000) !=
                      (undefined1  [16])0x0) {
                    pVVar1->yChromaOffset = (pGVar2->data_).s.length;
                    pGVar2 = rapidjson::
                             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             ::operator[]<char_const>
                                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                         *)state,"chromaFilter");
                    if ((undefined1  [16])
                        ((undefined1  [16])pGVar2->data_ & (undefined1  [16])0x40000000000000) !=
                        (undefined1  [16])0x0) {
                      pVVar1->chromaFilter = (pGVar2->data_).s.length;
                      pGVar2 = rapidjson::
                               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                               ::operator[]<char_const>
                                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                           *)state,"forceExplicitReconstruction");
                      if ((undefined1  [16])
                          ((undefined1  [16])pGVar2->data_ & (undefined1  [16])0x40000000000000) !=
                          (undefined1  [16])0x0) {
                        pVVar1->forceExplicitReconstruction = (pGVar2->data_).s.length;
                        return true;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  __assert_fail("data_.f.flags & kUintFlag",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                ,0x719,
                "unsigned int rapidjson::GenericValue<rapidjson::UTF8<>>::GetUint() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
               );
}

Assistant:

bool StateReplayer::Impl::parse_sampler_ycbcr_conversion(const Value &state,
                                                         VkSamplerYcbcrConversionCreateInfo **out_info)
{
	auto *info = allocator.allocate_cleared<VkSamplerYcbcrConversionCreateInfo>();
	*out_info = info;

	info->format = static_cast<VkFormat>(state["format"].GetUint());
	info->ycbcrModel = static_cast<VkSamplerYcbcrModelConversion>(state["ycbcrModel"].GetUint());
	info->ycbcrRange = static_cast<VkSamplerYcbcrRange>(state["ycbcrRange"].GetUint());
	info->components.r = static_cast<VkComponentSwizzle>(state["components"][0].GetUint());
	info->components.g = static_cast<VkComponentSwizzle>(state["components"][1].GetUint());
	info->components.b = static_cast<VkComponentSwizzle>(state["components"][2].GetUint());
	info->components.a = static_cast<VkComponentSwizzle>(state["components"][3].GetUint());
	info->xChromaOffset = static_cast<VkChromaLocation>(state["xChromaOffset"].GetUint());
	info->yChromaOffset = static_cast<VkChromaLocation>(state["yChromaOffset"].GetUint());
	info->chromaFilter = static_cast<VkFilter>(state["chromaFilter"].GetUint());
	info->forceExplicitReconstruction = state["forceExplicitReconstruction"].GetUint();

	return true;
}